

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v7::detail::
     handle_dynamic_spec<fmt::v7::detail::precision_checker,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
               (int *value,arg_ref<char> ref,
               basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  int iVar1;
  format_arg local_58;
  format_arg local_38;
  
  if (ref.kind == name) {
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::get<char>(&local_38,&ctx->args_,ref.val.name);
  }
  else {
    if (ref.kind != index) {
      return;
    }
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::get(&local_58,&ctx->args_,ref.val.index);
  }
  iVar1 = get_dynamic_spec<fmt::v7::detail::precision_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>,fmt::v7::detail::error_handler>
                    ();
  *value = iVar1;
  return;
}

Assistant:

void handle_dynamic_spec(int& value, arg_ref<typename Context::char_type> ref,
                         Context& ctx) {
  switch (ref.kind) {
  case arg_id_kind::none:
    break;
  case arg_id_kind::index:
    value = detail::get_dynamic_spec<Handler>(ctx.arg(ref.val.index),
                                              ctx.error_handler());
    break;
  case arg_id_kind::name:
    value = detail::get_dynamic_spec<Handler>(ctx.arg(ref.val.name),
                                              ctx.error_handler());
    break;
  }
}